

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::ByteCodeUsesInstr::Set(ByteCodeUsesInstr *this,Opnd *originalOperand)

{
  byte bVar1;
  BVIndex i;
  JitArenaAllocator *pJVar2;
  code *pcVar3;
  bool bVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  
  if (originalOperand == (Opnd *)0x0) {
LAB_004bbcaa:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x3be,"(originalOperand && originalOperand->GetStackSym())",
                       "originalOperand && originalOperand->GetStackSym()");
    if (!bVar4) goto LAB_004bbdc0;
    *puVar6 = 0;
  }
  else {
    pSVar5 = Opnd::GetStackSym(originalOperand);
    if (pSVar5 == (StackSym *)0x0) goto LAB_004bbcaa;
  }
  bVar1 = originalOperand->field_0xb;
  pSVar5 = Opnd::GetStackSym(originalOperand);
  if ((bVar1 & 8) == 0) {
    i = (pSVar5->super_Sym).m_id;
    if (this->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
               new<Memory::JitArenaAllocator>(0x20,((this->super_Instr).m_func)->m_alloc,0x3f1274);
      pJVar2 = ((this->super_Instr).m_func)->m_alloc;
      pBVar7->head = (Type_conflict)0x0;
      pBVar7->lastFoundIndex = (Type_conflict)0x0;
      pBVar7->alloc = pJVar2;
      pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
      this->byteCodeUpwardExposedUsed = pBVar7;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(this->byteCodeUpwardExposedUsed,i);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                     ,0x3c3,"(false)",
                     "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
  if (bVar4) {
    *puVar6 = 0;
    return;
  }
LAB_004bbdc0:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void ByteCodeUsesInstr::Set(IR::Opnd * originalOperand)
{
    Assert(originalOperand && originalOperand->GetStackSym());
    bool isJITOptimizedReg = originalOperand->GetIsJITOptimizedReg();
    SymID symId = originalOperand->GetStackSym()->m_id;
    if (isJITOptimizedReg)
    {
        AssertMsg(false, "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
        // Although we assert on debug builds, we should actually be ok with release builds
        // if we ignore the operand; not ignoring it, however, can cause us to introduce an
        // inconsistency in bytecode register lifetimes.
        return;
    }
    if (!this->byteCodeUpwardExposedUsed)
    {
        this->byteCodeUpwardExposedUsed = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
    }
    this->byteCodeUpwardExposedUsed->Set(symId);
}